

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O2

void DrawBoingBall(void)

{
  double dVar1;
  float fVar2;
  GLfloat long_lo;
  double delta_t;
  
  (*glad_glPushMatrix)();
  (*glad_glMatrixMode)(0x1700);
  (*glad_glTranslatef)(0.0,0.0,147.0);
  for (dVar1 = dt; 0.0 < dVar1; dVar1 = dVar1 - delta_t) {
    delta_t = 0.019999999552965164;
    if (dVar1 <= 0.019999999552965164) {
      delta_t = dVar1;
    }
    BounceBall(delta_t);
    fVar2 = (float)delta_t * 50.0 * deg_rot_y_inc + deg_rot_y;
    deg_rot_y = (GLfloat)(~-(uint)(fVar2 < 360.0) & (uint)(fVar2 + -360.0) |
                         (uint)fVar2 & -(uint)(fVar2 < 360.0));
  }
  (*glad_glTranslatef)(ball_x,ball_y,0.0);
  if (drawBallHow == DRAW_BALL_SHADOW) {
    (*glad_glTranslatef)(-20.0,10.0,0.0);
  }
  (*glad_glRotatef)(-20.0,0.0,0.0,1.0);
  (*glad_glRotatef)(deg_rot_y,0.0,1.0,0.0);
  (*glad_glCullFace)(0x404);
  (*glad_glEnable)(0xb44);
  (*glad_glEnable)(0xba1);
  long_lo = 0.0;
  while (long_lo < 180.0) {
    DrawBoingBallBand(long_lo,long_lo + 22.5);
    long_lo = long_lo + 22.5;
  }
  (*glad_glPopMatrix)();
  return;
}

Assistant:

void DrawBoingBall( void )
{
   GLfloat lon_deg;     /* degree of longitude */
   double dt_total, dt2;

   glPushMatrix();
   glMatrixMode( GL_MODELVIEW );

  /*
   * Another relative Z translation to separate objects.
   */
   glTranslatef( 0.0, 0.0, DIST_BALL );

   /* Update ball position and rotation (iterate if necessary) */
   dt_total = dt;
   while( dt_total > 0.0 )
   {
       dt2 = dt_total > MAX_DELTA_T ? MAX_DELTA_T : dt_total;
       dt_total -= dt2;
       BounceBall( dt2 );
       deg_rot_y = TruncateDeg( deg_rot_y + deg_rot_y_inc*((float)dt2*ANIMATION_SPEED) );
   }

   /* Set ball position */
   glTranslatef( ball_x, ball_y, 0.0 );

  /*
   * Offset the shadow.
   */
   if ( drawBallHow == DRAW_BALL_SHADOW )
   {
      glTranslatef( SHADOW_OFFSET_X,
                    SHADOW_OFFSET_Y,
                    SHADOW_OFFSET_Z );
   }

  /*
   * Tilt the ball.
   */
   glRotatef( -20.0, 0.0, 0.0, 1.0 );

  /*
   * Continually rotate ball around Y axis.
   */
   glRotatef( deg_rot_y, 0.0, 1.0, 0.0 );

  /*
   * Set OpenGL state for Boing ball.
   */
   glCullFace( GL_FRONT );
   glEnable( GL_CULL_FACE );
   glEnable( GL_NORMALIZE );

  /*
   * Build a faceted latitude slice of the Boing ball,
   * stepping same-sized vertical bands of the sphere.
   */
   for ( lon_deg = 0;
         lon_deg < 180;
         lon_deg += STEP_LONGITUDE )
   {
     /*
      * Draw a latitude circle at this longitude.
      */
      DrawBoingBallBand( lon_deg,
                         lon_deg + STEP_LONGITUDE );
   }

   glPopMatrix();

   return;
}